

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::Pxr24Compressor::uncompress
          (Pxr24Compressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  int iVar1;
  int in_ECX;
  undefined4 in_EDX;
  Vec2<int> *in_RSI;
  long in_RDI;
  char **in_stack_00000088;
  Box2i *in_stack_00000090;
  int in_stack_0000009c;
  char *in_stack_000000a0;
  Pxr24Compressor *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffb8;
  Vec2<int> in_stack_ffffffffffffffc0;
  Vec2<int> local_38 [4];
  int local_18;
  
  local_18 = in_ECX;
  Imath_2_5::Vec2<int>::Vec2(local_38,*(int *)(in_RDI + 0x30),in_ECX);
  Imath_2_5::Vec2<int>::Vec2
            ((Vec2<int> *)&stack0xffffffffffffffc0,*(int *)(in_RDI + 0x34),
             local_18 + *(int *)(in_RDI + 0x14) + -1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)in_stack_ffffffffffffffc0,
             (Vec2<int> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),in_RSI);
  iVar1 = uncompress(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000090,
                     in_stack_00000088);
  return iVar1;
}

Assistant:

int
Pxr24Compressor::uncompress (const char *inPtr,
			     int inSize,
			     int minY,
			     const char *&outPtr)
{
    return uncompress (inPtr,
	               inSize,
		       Box2i (V2i (_minX, minY),
			      V2i (_maxX, minY + _numScanLines - 1)),
		       outPtr);
}